

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallSet.h
# Opt level: O1

pair<llvm::NoneType,_bool> __thiscall
llvm::SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_>::insert
          (SmallSet<std::pair<int,_int>,_32U,_std::less<std::pair<int,_int>_>_> *this,
          pair<int,_int> *V)

{
  int *piVar1;
  uint uVar2;
  ulong uVar3;
  int *piVar4;
  long lVar5;
  pair<llvm::NoneType,_bool> pVar6;
  pair<std::_Rb_tree_iterator<std::pair<int,_int>_>,_bool> pVar7;
  
  if ((this->Set)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    piVar4 = (int *)(this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
                    super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
                    super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase
                    .BeginX;
    uVar2 = (this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
            super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
            super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase.Size;
    uVar3 = (ulong)uVar2;
    piVar1 = piVar4 + uVar3 * 2;
    if (uVar3 != 0) {
      lVar5 = uVar3 * 8;
      do {
        if ((*piVar4 == V->first) && (piVar4[1] == V->second)) break;
        piVar4 = piVar4 + 2;
        lVar5 = lVar5 + -8;
      } while (lVar5 != 0);
    }
    pVar6.first = None;
    pVar6.second = false;
    pVar6._5_3_ = 0;
    if (piVar4 == piVar1) {
      if (uVar2 < 0x20) {
        pVar6.first = None;
        pVar6.second = true;
        pVar6._5_3_ = 0;
        SmallVectorTemplateBase<std::pair<int,_int>,_true>::push_back
                  ((SmallVectorTemplateBase<std::pair<int,_int>,_true> *)this,V);
      }
      else {
        uVar2 = (this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
                super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
                super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase.
                Size;
        uVar3 = (ulong)uVar2;
        if (uVar2 != 0) {
          do {
            std::
            _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
            ::_M_insert_unique<std::pair<int,int>const&>
                      ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                        *)&this->Set,
                       (pair<int,_int> *)
                       ((long)(this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
                              super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
                              super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.
                              super_SmallVectorBase.BeginX + (uVar3 & 0xffffffff) * 8 + -8));
            uVar3 = (ulong)(this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
                           super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
                           super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.
                           super_SmallVectorBase.Size - 1;
            if ((this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
                super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
                super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase.
                Capacity < uVar3) {
              __assert_fail("Size <= capacity()",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                            ,0x44,"void llvm::SmallVectorBase::set_size(size_t)");
            }
            (this->Vector).super_SmallVectorImpl<std::pair<int,_int>_>.
            super_SmallVectorTemplateBase<std::pair<int,_int>,_true>.
            super_SmallVectorTemplateCommon<std::pair<int,_int>,_void>.super_SmallVectorBase.Size =
                 (uint)uVar3;
          } while ((uint)uVar3 != 0);
        }
        pVar6.first = None;
        pVar6.second = true;
        pVar6._5_3_ = 0;
        std::
        _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
        ::_M_insert_unique<std::pair<int,int>const&>
                  ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                    *)&this->Set,V);
      }
    }
  }
  else {
    pVar7 = std::
            _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
            ::_M_insert_unique<std::pair<int,int>const&>
                      ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                        *)&this->Set,V);
    pVar6 = (pair<llvm::NoneType,_bool>)(((ulong)pVar7.second << 0x20) + 1);
  }
  return pVar6;
}

Assistant:

std::pair<NoneType, bool> insert(const T &V) {
    if (!isSmall())
      return std::make_pair(None, Set.insert(V).second);

    VIterator I = vfind(V);
    if (I != Vector.end())    // Don't reinsert if it already exists.
      return std::make_pair(None, false);
    if (Vector.size() < N) {
      Vector.push_back(V);
      return std::make_pair(None, true);
    }

    // Otherwise, grow from vector to set.
    while (!Vector.empty()) {
      Set.insert(Vector.back());
      Vector.pop_back();
    }
    Set.insert(V);
    return std::make_pair(None, true);
  }